

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O3

void __thiscall RenX::LadderDatabase::~LadderDatabase(LadderDatabase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t __n;
  pointer __dest;
  pointer ppLVar3;
  Entry *pEVar4;
  
  *(undefined ***)this = &PTR_process_data_0015c330;
  pEVar4 = this->m_head;
  while (pEVar4 != (Entry *)0x0) {
    this->m_end = pEVar4;
    this->m_head = pEVar4->next;
    pcVar2 = (pEVar4->most_recent_name)._M_dataplus._M_p;
    paVar1 = &(pEVar4->most_recent_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pEVar4,0x140);
    pEVar4 = this->m_head;
  }
  ppLVar3 = g_ladder_databases.
            super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (g_ladder_databases.
      super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      g_ladder_databases.
      super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __n = (long)g_ladder_databases.
                super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)g_ladder_databases.
                super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    __dest = g_ladder_databases.
             super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      __n = __n - 8;
      if (*__dest == this) {
        if (__dest + 1 !=
            g_ladder_databases.
            super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          memmove(__dest,__dest + 1,__n);
        }
        ppLVar3 = g_ladder_databases.
                  super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        g_ladder_databases.
        super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppLVar3;
        break;
      }
      __dest = __dest + 1;
      ppLVar3 = g_ladder_databases.
                super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (__dest != g_ladder_databases.
                       super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (default_ladder_database == this) {
    if (g_ladder_databases.
        super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppLVar3) {
      default_ladder_database = (LadderDatabase *)0x0;
    }
    else {
      default_ladder_database =
           *g_ladder_databases.
            super__Vector_base<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
    }
  }
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  paVar1 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Jupiter::Database::~Database(&this->super_Database);
  return;
}

Assistant:

RenX::LadderDatabase::~LadderDatabase() {
	while (m_head != nullptr) {
		m_end = m_head;
		m_head = m_head->next;
		delete m_end;
	}

	for (auto itr = g_ladder_databases.begin(); itr != g_ladder_databases.end(); ++itr) {
		if (*itr == this) {
			g_ladder_databases.erase(itr);
			break;
		}
	}

	if (RenX::default_ladder_database == this) {
		if (g_ladder_databases.empty()) {
			RenX::default_ladder_database = nullptr;
		}
		else {
			RenX::default_ladder_database = g_ladder_databases[0];
		}
	}
}